

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hereticweaps.cpp
# Opt level: O2

int AF_A_ShutdownPhoenixPL2
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  player_t *ppVar2;
  AWeapon *this_00;
  bool bVar3;
  char *__assertion;
  AActor *actor;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052e08b;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    actor = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (actor == (AActor *)0x0) {
LAB_0052dfd1:
        actor = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052e08b;
        }
      }
      if (numparam == 1) goto LAB_0052e03f;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0052e07b;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0052e08b;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0052e07b;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0052e03f:
        ppVar2 = actor->player;
        if (ppVar2 != (player_t *)0x0) {
          S_StopSound(actor,1);
          this_00 = ppVar2->ReadyWeapon;
          if (this_00 != (AWeapon *)0x0) {
            AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1);
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0052e08b;
    }
    if (actor == (AActor *)0x0) goto LAB_0052dfd1;
  }
LAB_0052e07b:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0052e08b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_heretic/a_hereticweaps.cpp"
                ,0x543,
                "int AF_A_ShutdownPhoenixPL2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ShutdownPhoenixPL2)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}
	S_StopSound (self, CHAN_WEAPON);
	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}
	return 0;
}